

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ex_clipboard.c
# Opt level: O0

int main(int argc,char **argv)

{
  bool bVar1;
  bool bVar2;
  ulong uVar3;
  long lVar4;
  long lVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  ALLEGRO_EVENT event;
  _Bool redraw;
  _Bool done;
  char *text;
  ALLEGRO_FONT *font;
  ALLEGRO_EVENT_QUEUE *queue;
  ALLEGRO_TIMER *timer;
  ALLEGRO_DISPLAY *display;
  int local_88;
  int local_68;
  long local_38;
  
  local_38 = 0;
  bVar1 = false;
  bVar2 = true;
  uVar3 = al_install_system(0x5020700,atexit);
  if ((uVar3 & 1) == 0) {
    abort_example("Failed to init Allegro.\n");
  }
  uVar3 = al_init_image_addon();
  if ((uVar3 & 1) == 0) {
    abort_example("Failed to init IIO addon.\n");
  }
  al_init_font_addon();
  init_platform_specific();
  lVar4 = al_create_display(0x280,0x1e0);
  if (lVar4 == 0) {
    abort_example("Error creating display.\n");
  }
  uVar3 = al_install_keyboard();
  if ((uVar3 & 1) == 0) {
    abort_example("Error installing keyboard.\n");
  }
  lVar5 = al_load_font("data/fixed_font.tga",0);
  if (lVar5 == 0) {
    abort_example("Error loading data/fixed_font.tga\n");
  }
  uVar6 = al_create_timer(0x3fb999999999999a);
  uVar7 = al_create_event_queue();
  uVar8 = al_get_keyboard_event_source();
  al_register_event_source(uVar7,uVar8);
  uVar8 = al_get_timer_event_source(uVar6);
  al_register_event_source(uVar7,uVar8);
  uVar8 = al_get_display_event_source(lVar4);
  al_register_event_source(uVar7,uVar8);
  al_start_timer(uVar6);
  al_set_blender(0,1,3);
  while (!bVar1) {
    if ((bVar2) && (uVar3 = al_is_event_queue_empty(uVar7), (uVar3 & 1) != 0)) {
      if (local_38 != 0) {
        al_free_with_context
                  (local_38,0x43,
                   "/workspace/llm4binary/github/license_c_cmakelists/guzmandrade[P]allegro5/examples/ex_clipboard.c"
                   ,"main");
      }
      uVar3 = al_clipboard_has_text(lVar4);
      if ((uVar3 & 1) == 0) {
        local_38 = 0;
      }
      else {
        local_38 = al_get_clipboard_text(lVar4);
      }
      uVar8 = 0;
      uVar6 = al_map_rgb_f(0);
      al_clear_to_color(uVar6,uVar8);
      if (local_38 == 0) {
        uVar8 = 0;
        uVar6 = al_map_rgba_f(0x3f800000);
        al_draw_text(uVar6,uVar8,lVar5,0,"No clipboard text available.");
      }
      else {
        uVar8 = 0x3f800000;
        uVar6 = al_map_rgba_f(0x3f800000,0x3f800000,0x3f800000);
        al_draw_text(uVar6,uVar8,lVar5,0,local_38);
      }
      al_flip_display();
      bVar2 = false;
    }
    al_wait_for_event(uVar7);
    if (local_88 == 10) {
      if (local_68 == 0x3b) {
        bVar1 = true;
      }
      else if (local_68 == 0x4b) {
        al_set_clipboard_text(lVar4);
      }
    }
    else if (local_88 == 0x1e) {
      bVar2 = true;
    }
    else if (local_88 == 0x2a) {
      bVar1 = true;
    }
  }
  al_destroy_font(lVar5);
  return 0;
}

Assistant:

int main(int argc, char **argv)
{
   ALLEGRO_DISPLAY *display;
   ALLEGRO_TIMER *timer;
   ALLEGRO_EVENT_QUEUE *queue;
   ALLEGRO_FONT *font;
   char *text = NULL;
   bool done = false;
   bool redraw = true;

   (void)argc;
   (void)argv;

   if (!al_init()) {
      abort_example("Failed to init Allegro.\n");
   }

   if (!al_init_image_addon()) {
      abort_example("Failed to init IIO addon.\n");
   }

   al_init_font_addon();
   init_platform_specific();

   display = al_create_display(640, 480);
   if (!display) {
      abort_example("Error creating display.\n");
   }

   if (!al_install_keyboard()) {
      abort_example("Error installing keyboard.\n");
   }

   font = al_load_font("data/fixed_font.tga", 0, 0);
   if (!font) {
      abort_example("Error loading data/fixed_font.tga\n");
   }

   timer = al_create_timer(INTERVAL);

   queue = al_create_event_queue();
   al_register_event_source(queue, al_get_keyboard_event_source());
   al_register_event_source(queue, al_get_timer_event_source(timer));
   al_register_event_source(queue, al_get_display_event_source(display));

   al_start_timer(timer);

   al_set_blender(ALLEGRO_ADD, ALLEGRO_ONE, ALLEGRO_INVERSE_ALPHA);

   while (!done) {
      ALLEGRO_EVENT event;

      if (redraw && al_is_event_queue_empty(queue)) {
         if (text)
            al_free(text);
         if (al_clipboard_has_text(display)) {
            text = al_get_clipboard_text(display);
         }
         else {
            text = NULL;
         }


         al_clear_to_color(al_map_rgb_f(0, 0, 0));

         if (text) {
            al_draw_text(font, al_map_rgba_f(1, 1, 1, 1.0), 0, 0, 0, text);
         }
         else {
            al_draw_text(font, al_map_rgba_f(1, 0, 0, 1.0), 0, 0, 0,
                         "No clipboard text available.");
         }
         al_flip_display();
         redraw = false;
      }

      al_wait_for_event(queue, &event);
      switch (event.type) {
         case ALLEGRO_EVENT_KEY_DOWN:
            if (event.keyboard.keycode == ALLEGRO_KEY_ESCAPE) {
               done = true;
            }
            else if (event.keyboard.keycode == ALLEGRO_KEY_SPACE) {
               al_set_clipboard_text(display, "Copied from Allegro!");
            }
            break;

         case ALLEGRO_EVENT_DISPLAY_CLOSE:
            done = true;
            break;

         case ALLEGRO_EVENT_TIMER:
            redraw = true;
            break;
      }
   }

   al_destroy_font(font);

   return 0;
}